

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  curl_socket_t s_00;
  int s_01;
  uint uVar1;
  void *pvVar2;
  Curl_sh_entry *entry_00;
  byte bVar3;
  bool bVar4;
  int oldactions;
  int iStack_7c;
  _Bool stillused;
  int j_1;
  int j;
  uint uStack_70;
  _Bool sincebefore;
  uint comboaction;
  uint prevaction;
  uint action;
  int actions [5];
  uint curraction;
  int num;
  curl_socket_t s;
  Curl_sh_entry *entry;
  curl_socket_t local_38;
  int i;
  curl_socket_t socks [5];
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < 5; entry._4_4_ = entry._4_4_ + 1) {
    (&local_38)[entry._4_4_] = -1;
  }
  unique0x1000047c = data;
  actions[3] = multi_getsock(data,&local_38);
  entry._4_4_ = 0;
  do {
    bVar4 = false;
    bVar3 = (byte)entry._4_4_;
    if (entry._4_4_ < 5) {
      bVar4 = (actions[3] & (1 << (bVar3 & 0x1f) | 1 << (bVar3 + 0x10 & 0x1f))) != 0;
    }
    if (!bVar4) {
      actions[4] = entry._4_4_;
      entry._4_4_ = 0;
      do {
        if (stack0xffffffffffffffe0->numsocks <= entry._4_4_) {
          memcpy(stack0xffffffffffffffe0->sockets,&local_38,(long)actions[4] << 2);
          memcpy(stack0xffffffffffffffe0->actions,&prevaction,(long)actions[4] << 2);
          stack0xffffffffffffffe0->numsocks = actions[4];
          return CURLM_OK;
        }
        bVar4 = false;
        s_01 = stack0xffffffffffffffe0->sockets[entry._4_4_];
        for (oldactions = 0; oldactions < actions[4]; oldactions = oldactions + 1) {
          if (s_01 == (&local_38)[oldactions]) {
            bVar4 = true;
            break;
          }
        }
        if ((!bVar4) &&
           (entry_00 = sh_getentry(&multi->sockhash,s_01), entry_00 != (Curl_sh_entry *)0x0)) {
          uVar1 = stack0xffffffffffffffe0->actions[entry._4_4_];
          entry_00->users = entry_00->users - 1;
          if ((uVar1 & 2) != 0) {
            entry_00->writers = entry_00->writers - 1;
          }
          if ((uVar1 & 1) != 0) {
            entry_00->readers = entry_00->readers - 1;
          }
          if (entry_00->users == 0) {
            if (multi->socket_cb != (curl_socket_callback)0x0) {
              (*multi->socket_cb)(stack0xffffffffffffffe0,s_01,4,multi->socket_userp,
                                  entry_00->socketp);
            }
            sh_delentry(entry_00,&multi->sockhash,s_01);
          }
          else {
            Curl_hash_delete(&entry_00->transfers,socks + 4,8);
          }
        }
        entry._4_4_ = entry._4_4_ + 1;
      } while( true );
    }
    uStack_70 = 0;
    bVar4 = false;
    s_00 = (&local_38)[entry._4_4_];
    _num = sh_getentry(&multi->sockhash,s_00);
    comboaction = (uint)((actions[3] & 1 << (bVar3 & 0x1f)) != 0);
    if ((actions[3] & 1 << (bVar3 + 0x10 & 0x1f)) != 0) {
      comboaction = comboaction | 2;
    }
    (&prevaction)[entry._4_4_] = comboaction;
    if (_num == (Curl_sh_entry *)0x0) {
      _num = sh_addentry(&multi->sockhash,s_00);
      if (_num == (Curl_sh_entry *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    else {
      for (iStack_7c = 0; iStack_7c < stack0xffffffffffffffe0->numsocks; iStack_7c = iStack_7c + 1)
      {
        if (s_00 == stack0xffffffffffffffe0->sockets[iStack_7c]) {
          uStack_70 = stack0xffffffffffffffe0->actions[iStack_7c];
          bVar4 = true;
          break;
        }
      }
    }
    if ((bVar4) && (uStack_70 != comboaction)) {
      if ((uStack_70 & 1) != 0) {
        _num->readers = _num->readers - 1;
      }
      if ((uStack_70 & 2) != 0) {
        _num->writers = _num->writers - 1;
      }
      if ((comboaction & 1) != 0) {
        _num->readers = _num->readers + 1;
      }
      if ((comboaction & 2) != 0) {
        _num->writers = _num->writers + 1;
      }
    }
    else if (!bVar4) {
      _num->users = _num->users + 1;
      if ((comboaction & 1) != 0) {
        _num->readers = _num->readers + 1;
      }
      if ((comboaction & 2) != 0) {
        _num->writers = _num->writers + 1;
      }
      pvVar2 = Curl_hash_add(&_num->transfers,socks + 4,8,stack0xffffffffffffffe0);
      if (pvVar2 == (void *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    uVar1 = 0;
    if (_num->writers != 0) {
      uVar1 = 2;
    }
    uVar1 = uVar1 | _num->readers != 0;
    if ((!bVar4) || (_num->action != uVar1)) {
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(stack0xffffffffffffffe0,s_00,uVar1,multi->socket_userp,_num->socketp);
      }
      _num->action = uVar1;
    }
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && (entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}